

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::doRemoveCol(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int j)

{
  Item *this_00;
  int iVar1;
  Item *pIVar2;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  DataKey *pDVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  int iVar6;
  int *piVar7;
  char *pcVar8;
  char *__filename;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  
  pIVar2 = (this->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.theitem;
  iVar1 = (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thekey[j].idx;
  lVar12 = (long)pIVar2[iVar1].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
  if (0 < lVar12) {
    do {
      this_00 = (this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem +
                (this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey
                [pIVar2[iVar1].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem[lVar12 + -1].idx].idx;
      pNVar3 = (this_00->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      if ((pNVar3 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0x0) ||
         (pcVar8 = (char *)(long)(this_00->data).
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .memused, (long)pcVar8 < 1)) {
LAB_0026f1fe:
        __filename = (char *)0xffffffff;
      }
      else {
        if (pNVar3->idx == j) {
          bVar13 = true;
          __filename = (char *)0x0;
        }
        else {
          __filename = (char *)0x0;
          piVar7 = &pNVar3[1].idx;
          do {
            if (pcVar8 + -1 == __filename) goto LAB_0026f1fe;
            __filename = __filename + 1;
            iVar6 = *piVar7;
            piVar7 = piVar7 + 0xf;
          } while (iVar6 != j);
          bVar13 = __filename < pcVar8;
        }
        if (!bVar13) goto LAB_0026f1fe;
      }
      if (-1 < (int)__filename) {
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)this_00,__filename);
      }
      bVar13 = 1 < lVar12;
      lVar12 = lVar12 + -1;
    } while (bVar13);
  }
  iVar1 = (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  iVar6 = iVar1 + -1;
  if (iVar6 != j) {
    pIVar2 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.theitem;
    iVar1 = (this->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey[(long)iVar1 + -1].idx;
    lVar12 = (long)pIVar2[iVar1].data.
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused;
    if (0 < lVar12) {
      pNVar3 = pIVar2[iVar1].data.
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      pIVar2 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem;
      pDVar4 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey;
      do {
        iVar1 = pDVar4[pNVar3[lVar12 + -1].idx].idx;
        pNVar5 = pIVar2[iVar1].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        if ((pNVar5 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x0) ||
           (uVar11 = (ulong)pIVar2[iVar1].data.
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .memused, (long)uVar11 < 1)) {
LAB_0026f2c0:
          uVar9 = 0xffffffff;
        }
        else {
          if (pNVar5->idx == iVar6) {
            bVar13 = true;
            uVar10 = 0;
          }
          else {
            uVar10 = 0;
            piVar7 = &pNVar5[1].idx;
            do {
              if (uVar11 - 1 == uVar10) goto LAB_0026f2c0;
              uVar10 = uVar10 + 1;
              iVar1 = *piVar7;
              piVar7 = piVar7 + 0xf;
            } while (iVar1 != iVar6);
            bVar13 = uVar10 < uVar11;
          }
          uVar9 = (uint)uVar10;
          if (!bVar13) goto LAB_0026f2c0;
        }
        if (-1 < (int)uVar9) {
          pNVar5[uVar9].idx = j;
        }
        bVar13 = 1 < lVar12;
        lVar12 = lVar12 + -1;
      } while (bVar13);
    }
  }
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::remove(&this->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ,(char *)(ulong)(uint)j);
  return;
}

Assistant:

virtual void doRemoveCol(int j)
   {

      const SVectorBase<R>& vec = colVector(j);
      int i;

      // remove column vector from row file
      for(i = vec.size() - 1; i >= 0; --i)
      {
         SVectorBase<R>& remvec = rowVector_w(vec.index(i));
         int position = remvec.pos(j);

         assert(position != -1);

         if(position >= 0)
            remvec.remove(position);
      }

      // move last column to removed position
      int idx = nCols() - 1;

      if(j != idx)
      {
         const SVectorBase<R>& l_vec = colVector(idx);

         for(i = l_vec.size() - 1; i >= 0; --i)
         {
            SVectorBase<R>& movevec = rowVector_w(l_vec.index(i));
            int position = movevec.pos(idx);

            assert(position != -1);

            if(position >= 0)
               movevec.index(position) = j;
         }
      }

      LPColSetBase<R>::remove(j);
   }